

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::deleteRows(Highs *this,HighsInt *mask)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  reference pvVar3;
  long in_RSI;
  long in_RDI;
  HighsInt iRow;
  bool create_error;
  HighsIndexCollection index_collection;
  HighsInt original_num_row;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  int local_80;
  HighsIndexCollection *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  HighsInt in_stack_ffffffffffffff9c;
  HighsInt *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  HighsStatus in_stack_ffffffffffffffac;
  Highs *in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> vStack_30;
  int local_14;
  long local_10;
  
  local_10 = in_RSI;
  clearDerivedModelProperties
            ((Highs *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_14 = *(int *)(in_RDI + 0x13c);
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  HVar1 = create((HighsIndexCollection *)
                 CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                 in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
  deleteRowsInterface((Highs *)CONCAT17(HVar1 != 0,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88);
  for (local_80 = 0; local_80 < local_14; local_80 = local_80 + 1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&vStack_30,(long)local_80);
    *(value_type *)(local_10 + (long)local_80 * 4) = *pvVar3;
  }
  HVar2 = returnFromHighs(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
  HighsIndexCollection::~HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(HVar2,in_stack_ffffffffffffff60));
  return HVar2;
}

Assistant:

HighsStatus Highs::deleteRows(HighsInt* mask) {
  clearDerivedModelProperties();
  const HighsInt original_num_row = model_.lp_.num_row_;
  HighsIndexCollection index_collection;
  const bool create_error = create(index_collection, mask, original_num_row);
  assert(!create_error);
  (void)create_error;
  deleteRowsInterface(index_collection);
  for (HighsInt iRow = 0; iRow < original_num_row; iRow++)
    mask[iRow] = index_collection.mask_[iRow];
  return returnFromHighs(HighsStatus::kOk);
}